

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O3

int mg_session_read_duration(mg_session *session,mg_duration **duration)

{
  int iVar1;
  mg_duration *val;
  
  iVar1 = mg_session_check_struct_header(session,0xb4,'E');
  if (iVar1 == 0) {
    val = mg_duration_alloc(session->decoder_allocator);
    if (val == (mg_duration *)0x0) {
      mg_session_set_error(session,"out of memory");
      iVar1 = -3;
    }
    else {
      iVar1 = mg_session_read_integer(session,&val->months);
      if ((((iVar1 == 0) && (iVar1 = mg_session_read_integer(session,&val->days), iVar1 == 0)) &&
          (iVar1 = mg_session_read_integer(session,&val->seconds), iVar1 == 0)) &&
         (iVar1 = mg_session_read_integer(session,&val->nanoseconds), iVar1 == 0)) {
        *duration = val;
        return 0;
      }
      mg_allocator_free(session->decoder_allocator,val);
    }
  }
  return iVar1;
}

Assistant:

int mg_session_read_duration(mg_session *session, mg_duration **duration) {
  MG_RETURN_IF_FAILED(mg_session_check_struct_header(
      session, (uint8_t)(MG_MARKER_TINY_STRUCT + 4), MG_SIGNATURE_DURATION));
  mg_duration *duration_tmp = mg_duration_alloc(session->decoder_allocator);
  if (!duration_tmp) {
    mg_session_set_error(session, "out of memory");
    return MG_ERROR_OOM;
  }

  int status = 0;
  status = mg_session_read_integer(session, &duration_tmp->months);
  if (status != 0) {
    goto cleanup;
  }

  status = mg_session_read_integer(session, &duration_tmp->days);
  if (status != 0) {
    goto cleanup;
  }

  status = mg_session_read_integer(session, &duration_tmp->seconds);
  if (status != 0) {
    goto cleanup;
  }

  status = mg_session_read_integer(session, &duration_tmp->nanoseconds);
  if (status != 0) {
    goto cleanup;
  }

  *duration = duration_tmp;
  return 0;

cleanup:
  mg_allocator_free(session->decoder_allocator, duration_tmp);
  return status;
}